

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O0

void __thiscall
dynet::PickBatchElements::forward_dev_impl<dynet::Device_CPU>
          (PickBatchElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  size_type sVar2;
  ostream *poVar3;
  invalid_argument *piVar4;
  const_reference pvVar5;
  const_reference ppTVar6;
  Dim *in_RCX;
  ulong uVar7;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  long in_RDI;
  ostringstream oss_1;
  uint b;
  ostringstream oss;
  Dim *in_stack_fffffffffffffb28;
  Tensor *in_stack_fffffffffffffb30;
  TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffb38;
  TensorDevice<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffb40;
  ostringstream *this_00;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  value_type vVar8;
  string local_3c8 [32];
  ostringstream local_3a8 [376];
  uint local_230;
  undefined1 local_229;
  string local_228 [48];
  ostringstream local_1f8 [376];
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_80;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_70;
  Dim *local_20;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_18;
  
  if (*(long *)(in_RDI + 0x68) == 0) {
    local_20 = in_RCX;
    local_18 = in_RDX;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88));
    uVar1 = Dim::batch_elems(local_20);
    if (sVar2 != uVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      poVar3 = std::operator<<((ostream *)local_1f8,
                               "In PickBatchElements::forward, number of elements in the passed-in index vector ("
                              );
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88));
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
      std::operator<<(poVar3,
                      ") did not match number of elements in mini-batch elements in expression (of dimension"
                     );
      poVar3 = dynet::operator<<((ostream *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      std::operator<<(poVar3,")");
      local_229 = 1;
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::invalid_argument::invalid_argument(piVar4,local_228);
      local_229 = 0;
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    for (local_230 = 0; uVar7 = (ulong)local_230,
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88))
        , uVar7 < sVar2; local_230 = local_230 + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88),
                          (ulong)local_230);
      vVar8 = *pvVar5;
      ppTVar6 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](local_18,0);
      if (((*ppTVar6)->d).bd <= vVar8) {
        this_00 = local_3a8;
        std::__cxx11::ostringstream::ostringstream(this_00);
        poVar3 = std::operator<<((ostream *)this_00,
                                 "PickBatchElements::forward_impl requested element ");
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88)
                            ,(ulong)local_230);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
        poVar3 = std::operator<<(poVar3," from a batch size of ");
        ppTVar6 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                  operator[](local_18,0);
        std::ostream::operator<<(poVar3,((*ppTVar6)->d).bd);
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::invalid_argument::invalid_argument(piVar4,local_3c8);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                (local_18,0);
      Tensor::tbvec((Tensor *)CONCAT44(vVar8,in_stack_fffffffffffffb50));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88),
                 (ulong)local_230);
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
      chip<1l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                *)in_stack_fffffffffffffb40,(Index)in_stack_fffffffffffffb38);
      Tensor::tbvec((Tensor *)CONCAT44(vVar8,in_stack_fffffffffffffb50));
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
      chip<1l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                *)in_stack_fffffffffffffb40,(Index)in_stack_fffffffffffffb38);
      Eigen::
      TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
      ::device<Eigen::DefaultDevice>
                ((TensorBase<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                  *)in_stack_fffffffffffffb30,(DefaultDevice *)in_stack_fffffffffffffb28);
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    }
  }
  else {
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,0)
    ;
    Tensor::tbvec((Tensor *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    chip<1l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)in_stack_fffffffffffffb40,(Index)in_stack_fffffffffffffb38);
    local_80 = Tensor::tvec(in_stack_fffffffffffffb30);
    local_70 = Eigen::
               TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
               ::device<Eigen::DefaultDevice>
                         ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                           *)in_stack_fffffffffffffb30,(DefaultDevice *)in_stack_fffffffffffffb28);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  }
  return;
}

Assistant:

void PickBatchElements::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (pval) {
    fx.tvec().device(*dev.edevice) = xs[0]->tbvec().chip<1>(*pval);
  } else {
    DYNET_ASSERT(pvals != nullptr, "Neither single nor vector of elements available in PickBatchElements::forward");
    DYNET_ARG_CHECK(pvals->size() == fx.d.batch_elems(), 
                            "In PickBatchElements::forward, number of elements in the passed-in index vector (" << pvals->size() << ") "
                            "did not match number of elements in mini-batch elements in expression (of dimension" << fx.d << ")");
    for (unsigned b = 0; b < pvals->size(); ++b) {
      DYNET_ARG_CHECK((*pvals)[b] < xs[0]->d.bd,
                              "PickBatchElements::forward_impl requested element " << (*pvals)[b] << " from a batch size of " << xs[0]->d.bd);
      fx.tbvec().chip<1>(b).device(*dev.edevice) = xs[0]->tbvec().chip<1>((*pvals)[b]);
    }
  }
}